

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::AsyncInputStream::read(AsyncInputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  Own<kj::_::PromiseNode> local_20;
  
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,__fd))(&local_20);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_20,
             _::
             TransformPromiseNode<kj::_::Void,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:53:42),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar1 = local_20.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00449d10;
  this->_vptr_AsyncInputStream =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,unsigned_long,kj::AsyncInputStream::read(void*,unsigned_long)::$_0,kj::_::PropagateException>>
        ::instance;
  this[1]._vptr_AsyncInputStream = (_func_int **)this_00;
  if (local_20.ptr != (PromiseNode *)0x0) {
    local_20.ptr = (PromiseNode *)0x0;
    (**(local_20.disposer)->_vptr_Disposer)
              (local_20.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> AsyncInputStream::read(void* buffer, size_t bytes) {
  return read(buffer, bytes, bytes).then([](size_t) {});
}